

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

string * __thiscall
deqp::RobustBufferAccessBehavior::ImageLoadStoreTest::getComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,ImageLoadStoreTest *this,VERSION version)

{
  TEST_CASES TVar1;
  GLchar *__s;
  size_t sVar2;
  TestError *pTVar3;
  size_t temp_position;
  size_t local_78;
  size_t position;
  GLchar *local_60;
  GLchar *type;
  GLchar *point_source;
  GLchar *point_destination;
  GLchar *offset_source;
  GLchar *offset_destination;
  GLchar *image;
  GLchar *format;
  GLchar *copy;
  ImageLoadStoreTest *pIStack_18;
  VERSION version_local;
  ImageLoadStoreTest *this_local;
  string *source;
  
  __s = getComputeShader::template_code;
  format = getComputeShader::copy_regular;
  image = getComputeShader::format_r8;
  offset_destination = getComputeShader::image_vec4;
  offset_source = getComputeShader::offset_valid;
  point_destination = getComputeShader::offset_valid;
  point_source = getComputeShader::point_valid;
  type = getComputeShader::point_valid;
  local_60 = getComputeShader::type_vec4;
  copy._4_4_ = version;
  pIStack_18 = this;
  this_local = (ImageLoadStoreTest *)__return_storage_ptr__;
  if (version != VALID) {
    if (version == SOURCE_INVALID) {
      type = getComputeShader::point_invalid;
      point_destination = getComputeShader::offset_invalid;
    }
    else {
      if (version != DESTINATION_INVALID) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Invalid enum",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                   ,0xa47);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      point_source = getComputeShader::point_invalid;
      offset_source = getComputeShader::offset_invalid;
    }
  }
  switch((this->super_TexelFetchTest).m_test_case) {
  case R8:
    break;
  case RG8_SNORM:
    image = getComputeShader::format_rg8_snorm;
    break;
  case R32UI_MULTISAMPLE:
    format = getComputeShader::copy_multisampled;
    image = getComputeShader::format_r32ui;
    offset_destination = getComputeShader::image_uvec4_ms;
    point_source = getComputeShader::point_valid;
    type = getComputeShader::point_valid;
    local_60 = getComputeShader::type_uvec4;
    break;
  case RGBA32F:
    image = getComputeShader::format_rgba32f;
    break;
  case R32UI_MIPMAP:
    image = getComputeShader::format_r32ui;
    offset_destination = getComputeShader::image_uvec4;
    local_60 = getComputeShader::type_uvec4;
    break;
  default:
    pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar3,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
               ,0xa62);
    __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_78 = 0;
  temp_position._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)((long)&temp_position + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&temp_position + 6));
  replaceToken("IMAGE",&local_78,offset_destination,__return_storage_ptr__);
  replaceToken("FORMAT",&local_78,image,__return_storage_ptr__);
  replaceToken("IMAGE",&local_78,offset_destination,__return_storage_ptr__);
  replaceToken("POINT",&local_78,point_source,__return_storage_ptr__);
  replaceToken("POINT",&local_78,type,__return_storage_ptr__);
  sVar2 = local_78;
  replaceToken("COPY",&local_78,format,__return_storage_ptr__);
  TVar1 = (this->super_TexelFetchTest).m_test_case;
  local_78 = sVar2;
  if (RG8_SNORM < TVar1) {
    if (TVar1 == R32UI_MULTISAMPLE) {
      replaceToken("TYPE",&local_78,local_60,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,point_destination,__return_storage_ptr__);
      replaceToken("TYPE",&local_78,local_60,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,point_destination,__return_storage_ptr__);
      replaceToken("TYPE",&local_78,local_60,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,point_destination,__return_storage_ptr__);
      replaceToken("TYPE",&local_78,local_60,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,point_destination,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,offset_source,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,offset_source,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,offset_source,__return_storage_ptr__);
      replaceToken("OFFSET",&local_78,offset_source,__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if (1 < TVar1 - RGBA32F) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                 ,0xa89);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  replaceToken("TYPE",&local_78,local_60,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageLoadStoreTest::getComputeShader(VERSION version)
{
	static const GLchar* template_code = "#version 430 core\n"
										 "\n"
										 "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
										 "\n"
										 "layout (location = 1)        writeonly uniform IMAGE uni_destination_image;\n"
										 "layout (location = 0, FORMAT) readonly  uniform IMAGE uni_source_image;\n"
										 "\n"
										 "void main()\n"
										 "{\n"
										 "    const ivec2 point_destination = POINT;\n"
										 "    const ivec2 point_source      = POINT;\n"
										 "\n"
										 "COPY"
										 "}\n"
										 "\n";

	static const GLchar* copy_multisampled =
		"    const TYPE color_0 = imageLoad(uni_source_image, point_source, 0 + OFFSET);\n"
		"    const TYPE color_1 = imageLoad(uni_source_image, point_source, 1 + OFFSET);\n"
		"    const TYPE color_2 = imageLoad(uni_source_image, point_source, 2 + OFFSET);\n"
		"    const TYPE color_3 = imageLoad(uni_source_image, point_source, 3 + OFFSET);\n"
		"    imageStore(uni_destination_image, point_destination, 0 + OFFSET, color_0);\n"
		"    imageStore(uni_destination_image, point_destination, 1 + OFFSET, color_1);\n"
		"    imageStore(uni_destination_image, point_destination, 2 + OFFSET, color_2);\n"
		"    imageStore(uni_destination_image, point_destination, 3 + OFFSET, color_3);\n";

	static const GLchar* copy_regular =
		"    const TYPE color = imageLoad(uni_source_image, point_source);\n"
		"    //imageStore(uni_destination_image, point_destination, vec4(0, 0, 0, 0));\n"
		"    imageStore(uni_destination_image, point_destination, color);\n";

	static const GLchar* format_r8		  = "r8";
	static const GLchar* format_rg8_snorm = "rg8_snorm";
	static const GLchar* format_rgba32f   = "rgba32f";
	static const GLchar* format_r32ui	 = "r32ui";

	static const GLchar* image_vec4 = "image2D";

	static const GLchar* image_uvec4 = "uimage2D";

	static const GLchar* image_uvec4_ms = "uimage2DMS";

	static const GLchar* offset_invalid = "4";
	static const GLchar* offset_valid   = "0";

	static const GLchar* point_invalid = "ivec2(gl_WorkGroupID.x + 16, gl_WorkGroupID.y + 16)";

	static const GLchar* point_valid = "ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y)";

	static const GLchar* type_vec4  = "vec4";
	static const GLchar* type_uvec4 = "uvec4";

	const GLchar* copy				 = copy_regular;
	const GLchar* format			 = format_r8;
	const GLchar* image				 = image_vec4;
	const GLchar* offset_destination = offset_valid;
	const GLchar* offset_source		 = offset_valid;
	const GLchar* point_destination  = point_valid;
	const GLchar* point_source		 = point_valid;
	const GLchar* type				 = type_vec4;

	switch (version)
	{
	case VALID:
		break;
	case SOURCE_INVALID:
		point_source  = point_invalid;
		offset_source = offset_invalid;
		break;
	case DESTINATION_INVALID:
		point_destination  = point_invalid;
		offset_destination = offset_invalid;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	switch (m_test_case)
	{
	case R8:
		break;
	case RG8_SNORM:
		format = format_rg8_snorm;
		break;
	case RGBA32F:
		format = format_rgba32f;
		break;
	case R32UI_MIPMAP:
		format = format_r32ui;
		image  = image_uvec4;
		type   = type_uvec4;
		break;
	case R32UI_MULTISAMPLE:
		copy			  = copy_multisampled;
		format			  = format_r32ui;
		image			  = image_uvec4_ms;
		point_destination = point_valid;
		point_source	  = point_valid;
		type			  = type_uvec4;
		break;
	default:
		TCU_FAIL("Invalid enum");
	};

	size_t		position = 0;
	std::string source   = template_code;

	replaceToken("IMAGE", position, image, source);
	replaceToken("FORMAT", position, format, source);
	replaceToken("IMAGE", position, image, source);
	replaceToken("POINT", position, point_destination, source);
	replaceToken("POINT", position, point_source, source);

	size_t temp_position = position;
	replaceToken("COPY", position, copy, source);
	position = temp_position;

	switch (m_test_case)
	{
	case R8:
	case RG8_SNORM:
	case RGBA32F:
	case R32UI_MIPMAP:
		replaceToken("TYPE", position, type, source);
		break;
	case R32UI_MULTISAMPLE:
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("TYPE", position, type, source);
		replaceToken("OFFSET", position, offset_source, source);
		replaceToken("OFFSET", position, offset_destination, source);
		replaceToken("OFFSET", position, offset_destination, source);
		replaceToken("OFFSET", position, offset_destination, source);
		replaceToken("OFFSET", position, offset_destination, source);
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return source;
}